

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  World *this;
  Sphere *this_00;
  Parallelepiped *this_01;
  CornellBox *this_02;
  PointLight *pPVar1;
  Camera *this_03;
  ColorRGB local_280;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_270;
  ColorRGB local_260;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_250;
  ColorRGB local_240;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_230;
  ColorRGB local_220;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_210;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_200;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1f0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1a0;
  ColorRGB local_190;
  tmat4x4<float> Result;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_140;
  mat4 model;
  tmat4x4<float> Result_2;
  tmat4x4<float> local_b0;
  tmat4x4<float> Result_1;
  
  this = (World *)operator_new(0x38);
  World::World(this);
  this_00 = (Sphere *)operator_new(0xa8);
  Result.value[0].field_0.field_0.x = 1.0;
  Result.value[0].field_0._4_8_ = 0;
  Result.value._12_8_ = 0;
  Result.value[1].field_0.field_0.y = 1.0;
  Result.value[1].field_0._8_8_ = 0;
  Result.value[2].field_0._0_8_ = 0;
  Result.value[2].field_0.field_0.z = 1.0;
  Result.value[2].field_0.field_0.w = 0.0;
  Result.value[3].field_0.field_0.x = 6.0;
  Result.value[3].field_0.field_0.y = -7.0;
  Result.value[3].field_0.field_0.z = -50.0;
  Result.value[3].field_0.field_0.w = 1.0;
  ColorRGB::ColorRGB(&local_190,1.0,1.0,1.0);
  model.value[0].field_0.field_0.x = 3.0;
  Sphere::Sphere(this_00,&Result,local_190,(float *)&model);
  World::addSceneObject(this,(SceneObject *)this_00);
  Result_1.value[0].field_0.field_0.x = 1.0;
  Result_1.value[0].field_0._4_8_ = 0;
  Result_1.value._12_8_ = 0;
  Result_1.value[1].field_0.field_0.y = 1.0;
  Result_1.value[1].field_0._8_8_ = 0;
  Result_1.value[2].field_0._0_8_ = 0;
  Result_1.value[2].field_0._8_8_ = 0x3f800000;
  Result_1.value[3].field_0._0_8_ = 0xc1200000c0800000;
  Result_1.value[3].field_0._8_8_ = 0x3f800000c25c0000;
  local_140._0_8_ = 0x3f80000000000000;
  local_140.field_0.z = 0.0;
  Result_2.value[0].field_0.field_0.x = 40.0;
  Result.value[0].field_0.field_0.x = 1.0;
  Result.value[0].field_0._4_8_ = 0;
  Result.value._12_8_ = 0;
  Result.value[1].field_0.field_0.y = 1.0;
  Result.value[1].field_0._8_8_ = 0;
  Result.value[2].field_0._0_8_ = 0;
  Result.value[2].field_0.field_0.z = 1.0;
  Result.value[2].field_0.field_0.w = 0.0;
  Result.value[3].field_0.field_0.x = 0.0;
  Result.value[3].field_0.field_0.y = 0.0;
  Result.value[3].field_0.field_0.z = 0.0;
  Result.value[3].field_0.field_0.w = 1.0;
  glm::rotate<float>(&local_b0,&Result,(float *)&Result_2,(tvec3<float> *)&local_140.field_0);
  glm::detail::operator*(&Result_1,&local_b0);
  Result_2.value[0].field_0.field_0.x = 10.0;
  Result_2.value[0].field_0._4_8_ = 0;
  Result_2.value._12_8_ = 0;
  Result_2.value[1].field_0.field_0.y = 12.0;
  Result_2.value[1].field_0._8_8_ = 0;
  Result_2.value[2].field_0._0_8_ = 0;
  Result_2.value[2].field_0.field_0.z = 8.0;
  Result_2.value._44_8_ = 0;
  Result_2.value[3].field_0._4_8_ = 0;
  Result_2.value[3].field_0.field_0.w = 1.0;
  glm::detail::operator*(&Result,&Result_2);
  this_01 = (Parallelepiped *)operator_new(0x120);
  local_1a0._0_8_ = 0;
  local_1a0.field_0.z = 0.0;
  local_1b0._0_8_ = 0x3f800000;
  local_1b0.field_0.z = 0.0;
  local_1c0._0_8_ = 0x3f80000000000000;
  local_1c0.field_0.z = 0.0;
  local_1d0._0_8_ = 0x3f8000003f800000;
  local_1d0.field_0.z = 0.0;
  local_1e0._0_8_ = 0;
  local_1e0.field_0.z = -1.0;
  local_1f0._0_8_ = 0x3f800000;
  local_1f0.field_0.z = -1.0;
  local_200._0_8_ = 0x3f80000000000000;
  local_200.field_0.z = -1.0;
  local_210._0_8_ = 0x3f8000003f800000;
  local_210.field_0.z = -1.0;
  ColorRGB::ColorRGB(&local_220,1.0,1.0,0.0);
  Parallelepiped::Parallelepiped
            (this_01,&model,(vec3 *)&local_1a0.field_0,(vec3 *)&local_1b0.field_0,
             (vec3 *)&local_1c0.field_0,(vec3 *)&local_1d0.field_0,(vec3 *)&local_1e0.field_0,
             (vec3 *)&local_1f0.field_0,(vec3 *)&local_200.field_0,(vec3 *)&local_210.field_0,true,
             local_220);
  World::addSceneObject(this,(SceneObject *)this_01);
  this_02 = (CornellBox *)operator_new(0x148);
  CornellBox::CornellBox(this_02);
  World::addSceneObject(this,(SceneObject *)this_02);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_230._0_8_ = 0x40c0000000000000;
  local_230.field_0.z = -40.0;
  ColorRGB::ColorRGB(&local_240,0.0,0.0,0.5);
  PointLight::PointLight(pPVar1,(vec3 *)&local_230.field_0,local_240);
  World::addPointLight(this,pPVar1);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_250._0_8_ = 0xc0c00000c0a00000;
  local_250.field_0.z = -44.0;
  ColorRGB::ColorRGB(&local_260,0.5,0.0,0.0);
  PointLight::PointLight(pPVar1,(vec3 *)&local_250.field_0,local_260);
  World::addPointLight(this,pPVar1);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_270._0_8_ = 0xc0c0000040800000;
  local_270.field_0.z = -40.0;
  ColorRGB::ColorRGB(&local_280,0.0,0.5,0.0);
  PointLight::PointLight(pPVar1,(vec3 *)&local_270.field_0,local_280);
  World::addPointLight(this,pPVar1);
  this_03 = (Camera *)operator_new(0x38);
  BoundingBox::intersects((BoundingBox *)this_03);
  Camera::raytraceToFile(this_03,this,"./test.ppm");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{    
    World *world = new World();
    SceneObject *so;
    
//     so = new Sphere(glm::translate<float>(4.0, 0.0, -45.0), ColorRGB(1.0, 1.0, 1.0), 1.0);
//     world->addSceneObject(so);
    
    //some nice spheres
    so = new Sphere(glm::translate<float>(6.0, -7.0, -50.0), ColorRGB(1.0, 1.0, 1.0), 3.0);
    world->addSceneObject(so);
    
    glm::mat4 model =
        glm::translate<float>(-4.0, -10.0, -55.0) *
        glm::rotate<float>(40, glm::vec3(0, 1, 0)) *
        glm::scale<float>(10, 12, 8);
    
    so = new Parallelepiped(
        model,
        glm::vec3(0, 0, 0),
        glm::vec3(1, 0, 0),
        glm::vec3(0, 1, 0),
        glm::vec3(1, 1, 0),
        glm::vec3(0, 0, -1),
        glm::vec3(1, 0, -1),
        glm::vec3(0, 1, -1),
        glm::vec3(1, 1, -1),
        true,
        ColorRGB(1.0, 1.0, 0.0));
    world->addSceneObject(so);
    
//     so = new Parallelepiped(
//         glm::translate<float>(3.0, 0.0, -45.0),
//         glm::vec3(0, 0, 0),
//         glm::vec3(1, 0, 0),
//         glm::vec3(0, 1, 0),
//         glm::vec3(1, 1, 0),
//         glm::vec3(0, 0, -1),
//         glm::vec3(1, 0, -1),
//         glm::vec3(0, 1, -1),
//         glm::vec3(1, 1, -1),
//         true,
//         ColorRGB(1.0, 1.0, 1.0));
//     world->addSceneObject(so);
    
    so = new CornellBox();
    world->addSceneObject(so);
    
        
    world->addPointLight(new PointLight(glm::vec3(0, 6, -40), ColorRGB(0, 0, 0.5)));
    world->addPointLight(new PointLight(glm::vec3(-5, -6, -44), ColorRGB(0.5, 0, 0)));
    world->addPointLight(new PointLight(glm::vec3(4, -6, -40), ColorRGB(0, 0.5, 0)));
    
    Camera *cam = new Camera();
        
    cam->raytraceToFile(world, "./test.ppm");

    std::cout << "Done" << std::endl;
    return 0;
}